

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall CConsole::Print(CConsole *this,int Level,char *pFrom,char *pStr,bool Highlighted)

{
  void **ppvVar1;
  long lVar2;
  long in_FS_OFFSET;
  char aBuf [1024];
  char aTimeBuf [80];
  char acStack_488 [1024];
  char local_88 [80];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str_timestamp_format(local_88,0x50,"%H:%M:%S");
  str_format(acStack_488,0x400,"[%s][%s]: %s",local_88,pFrom,pStr);
  dbg_msg(pFrom,"%s",pStr);
  if (0 < this->m_NumPrintCB) {
    ppvVar1 = &this->m_aPrintCB[0].m_pPrintCallbackUserdata;
    lVar2 = 0;
    do {
      if ((Level <= ((anon_struct_24_3_da75e937 *)(ppvVar1 + -2))->m_OutputLevel) &&
         ((FPrintCallback)ppvVar1[-1] != (FPrintCallback)0x0)) {
        (*(code *)ppvVar1[-1])(acStack_488,*ppvVar1,Highlighted);
      }
      lVar2 = lVar2 + 1;
      ppvVar1 = ppvVar1 + 3;
    } while (lVar2 < this->m_NumPrintCB);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::Print(int Level, const char *pFrom, const char *pStr, bool Highlighted)
{
	char aTimeBuf[80];
	str_timestamp_format(aTimeBuf, sizeof(aTimeBuf), FORMAT_TIME);

	char aBuf[1024];
	str_format(aBuf, sizeof(aBuf), "[%s][%s]: %s", aTimeBuf, pFrom, pStr);
	dbg_msg(pFrom ,"%s", pStr);
	for(int i = 0; i < m_NumPrintCB; ++i)
	{
		if(Level <= m_aPrintCB[i].m_OutputLevel && m_aPrintCB[i].m_pfnPrintCallback)
		{
			m_aPrintCB[i].m_pfnPrintCallback(aBuf, m_aPrintCB[i].m_pPrintCallbackUserdata, Highlighted);
		}
	}
}